

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O1

int zt_ipv4_tbl_add_node(zt_ipv4_tbl *tbl,zt_ipv4_node *node)

{
  uint uVar1;
  zt_mem_pool *pool;
  zt_ipv4_node **__s;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  
  iVar4 = -1;
  if (node != (zt_ipv4_node *)0x0 && tbl != (zt_ipv4_tbl *)0x0) {
    if (node->addr->bitlen == '\0') {
      tbl->any = node;
    }
    else {
      pool = zt_mem_pool_get("zt_ipv4_node_hash");
      if (pool == (zt_mem_pool *)0x0) {
        return -1;
      }
      bVar3 = node->addr->bitlen - 1;
      if (tbl->tbl[bVar3] == (zt_ipv4_node **)0x0) {
        __s = (zt_ipv4_node **)zt_mem_pool_alloc(pool);
        if (__s == (zt_ipv4_node **)0x0) {
          return -1;
        }
        memset(__s,0,(ulong)tbl->sz << 3);
        tbl->tbl[bVar3] = __s;
      }
      uVar1 = tbl->sz - 1 & node->addr->addr;
      if (tbl->tbl[bVar3][uVar1] != (zt_ipv4_node *)0x0) {
        node->next = tbl->tbl[bVar3][uVar1];
      }
      tbl->tbl[bVar3][uVar1] = node;
      uVar2 = 0;
      do {
        if (tbl->in[uVar2] == '\0') goto LAB_001235bc;
        if (tbl->in[uVar2] == node->addr->bitlen) goto LAB_001235d4;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x20);
      uVar2 = 0x20;
LAB_001235bc:
      tbl->in[uVar2 & 0xffffffff] = node->addr->bitlen;
    }
LAB_001235d4:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
zt_ipv4_tbl_add_node(zt_ipv4_tbl * tbl, zt_ipv4_node * node)
{
    zt_ipv4_node *node_slot;
    zt_mem_pool  *pool;
    uint32_t      key;
    uint8_t       blen;
    int           is_in;
    int           i;

    if (!tbl || !node) {
        return -1;
    }

    if (node->addr->bitlen == 0) {
        /*
         * this is a 0.0.0.0/0 network, set the any to this node
         */
        tbl->any = node;
        return 0;
    }

    if (!(pool = zt_mem_pool_get("zt_ipv4_node_hash"))) {
        return -1;
    }

    is_in = 0;
    blen = node->addr->bitlen - 1;

    if (tbl->tbl[blen] == NULL) {
        zt_ipv4_node **hash_entry;

        if (!(hash_entry = zt_mem_pool_alloc(pool))) {
            return -1;
        }

        memset(hash_entry, 0, sizeof(zt_ipv4_node *) * tbl->sz);

        tbl->tbl[blen] = hash_entry;
    }

    key = node->addr->addr & (tbl->sz - 1);
    node_slot = tbl->tbl[blen][key];

    if (node_slot != NULL) {
        node->next = node_slot;
    }

    tbl->tbl[blen][key] = node;

    /*
     * set our in array to this bitlen if it doesn't exist
     * we use this to iterate through the prefixes.
     *
     * For example if the bitlen is /32 and we add one node
     * tbl->in[0] would be 32.
     *
     * When we search for an address within our table the
     * only work we have to do is checking bitlengths found
     * within this in array
     */

    for (i = 0; i < 32; i++) {
        if (tbl->in[i] == 0) {
            break;
        }

        if (tbl->in[i] == node->addr->bitlen) {
            is_in = 1;
            break;
        }
    }

    /*
     * the bitlen doesn't exist, so add it to the last
     * open slot
     */
    if (is_in == 0) {
        tbl->in[i] = node->addr->bitlen;
    }

    return 0;
}